

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

void __thiscall
dgMeshEffect::BuildFromVertexListIndexList
          (dgMeshEffect *this,HaI32 faceCount,HaI32 *faceIndexCount,HaI32 *faceMaterialIndex,
          HaF32 *vertex,HaI32 vertexStrideInBytes,HaI32 *vertexIndex,HaF32 *normal,
          HaI32 normalStrideInBytes,HaI32 *normalIndex,HaF32 *uv0,HaI32 uv0StrideInBytes,
          HaI32 *uv0Index,HaF32 *uv1,HaI32 uv1StrideInBytes,HaI32 *uv1Index)

{
  int count;
  dgTreeNode *this_00;
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  HaI32 HVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  int *piVar18;
  dgEdge *pdVar19;
  int iVar20;
  int iVar21;
  undefined1 *puVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  int iVar29;
  uint uVar30;
  int iVar31;
  long lVar32;
  float *pfVar33;
  ushort uVar34;
  ushort uVar35;
  undefined1 auVar37 [32];
  undefined1 auVar36 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 in_ZMM2 [64];
  dgStack<signed_char> faceMark;
  dgStack<int> attrIndexMap;
  HaI64 userdata [256];
  HaI32 index [256];
  int local_ce4;
  dgStack<signed_char> local_c78;
  dgStack<int> local_c68;
  ulong local_c58;
  HaI32 *local_c50;
  long local_c48;
  long local_c40;
  undefined1 local_c38 [64];
  undefined1 local_bf8 [16];
  double local_be8;
  double local_be0;
  uint local_438;
  undefined1 local_434 [1028];
  
  *(undefined4 *)&(this->super_dgRefCounter).field_0xc = 0;
  this->m_atribCount = 0;
  uVar9 = (ulong)(uint)faceCount;
  this_00 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head;
  local_c50 = faceMaterialIndex;
  if (this_00 != (dgTreeNode *)0x0) {
    (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_count = 0;
    dgRedBackNode::RemoveAll(&this_00->super_dgRedBackNode);
    (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head = (dgTreeNode *)0x0;
  }
  if (faceCount < 1) {
    uVar30 = 0;
    iVar21 = 0;
    bVar2 = false;
  }
  else {
    auVar38 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar40 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    uVar15 = 0;
    iVar21 = 0;
    uVar26 = 0;
    do {
      iVar20 = faceIndexCount[uVar15];
      if (0 < iVar20) {
        auVar41 = vpbroadcastd_avx512f();
        auVar42 = vpbroadcastq_avx512f();
        uVar26 = 0;
        do {
          auVar43 = vpbroadcastq_avx512f();
          auVar44 = vmovdqa64_avx512f(auVar41);
          auVar41 = vporq_avx512f(auVar43,auVar38);
          auVar43 = vporq_avx512f(auVar43,auVar39);
          uVar3 = vpcmpuq_avx512f(auVar43,auVar42,2);
          bVar11 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar41,auVar42,2);
          bVar10 = (byte)uVar3;
          uVar5 = CONCAT11(bVar10,bVar11);
          auVar41 = vmovdqu32_avx512f(*(undefined1 (*) [64])(vertexIndex + (long)iVar21 + uVar26));
          auVar43._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar41._4_4_;
          auVar43._0_4_ = (uint)(bVar11 & 1) * auVar41._0_4_;
          auVar43._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar41._8_4_;
          auVar43._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar41._12_4_;
          auVar43._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * auVar41._16_4_;
          auVar43._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * auVar41._20_4_;
          auVar43._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * auVar41._24_4_;
          auVar43._28_4_ = (uint)((byte)(uVar5 >> 7) & 1) * auVar41._28_4_;
          auVar43._32_4_ = (uint)(bVar10 & 1) * auVar41._32_4_;
          auVar43._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar41._36_4_;
          auVar43._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar41._40_4_;
          auVar43._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar41._44_4_;
          auVar43._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar41._48_4_;
          auVar43._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar41._52_4_;
          auVar43._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar41._56_4_;
          auVar43._60_4_ = (uint)(bVar10 >> 7) * auVar41._60_4_;
          uVar26 = uVar26 + 0x10;
          auVar41 = vpsubd_avx512f(auVar43,auVar40);
          auVar41 = vpmaxsd_avx512f(auVar41,auVar44);
        } while ((iVar20 + 0xfU & 0xfffffff0) != uVar26);
        auVar42 = vmovdqa32_avx512f(auVar41);
        auVar41._0_4_ =
             (uint)(bVar11 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar44._0_4_;
        bVar2 = (bool)((byte)(uVar5 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar2 * auVar42._4_4_ | (uint)!bVar2 * auVar44._4_4_;
        bVar2 = (bool)((byte)(uVar5 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar2 * auVar42._8_4_ | (uint)!bVar2 * auVar44._8_4_;
        bVar2 = (bool)((byte)(uVar5 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar2 * auVar42._12_4_ | (uint)!bVar2 * auVar44._12_4_;
        bVar2 = (bool)((byte)(uVar5 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar2 * auVar42._16_4_ | (uint)!bVar2 * auVar44._16_4_;
        bVar2 = (bool)((byte)(uVar5 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar2 * auVar42._20_4_ | (uint)!bVar2 * auVar44._20_4_;
        bVar2 = (bool)((byte)(uVar5 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar2 * auVar42._24_4_ | (uint)!bVar2 * auVar44._24_4_;
        bVar2 = (bool)((byte)(uVar5 >> 7) & 1);
        auVar41._28_4_ = (uint)bVar2 * auVar42._28_4_ | (uint)!bVar2 * auVar44._28_4_;
        auVar41._32_4_ =
             (uint)(bVar10 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar44._32_4_;
        bVar2 = (bool)(bVar10 >> 1 & 1);
        auVar41._36_4_ = (uint)bVar2 * auVar42._36_4_ | (uint)!bVar2 * auVar44._36_4_;
        bVar2 = (bool)(bVar10 >> 2 & 1);
        auVar41._40_4_ = (uint)bVar2 * auVar42._40_4_ | (uint)!bVar2 * auVar44._40_4_;
        bVar2 = (bool)(bVar10 >> 3 & 1);
        auVar41._44_4_ = (uint)bVar2 * auVar42._44_4_ | (uint)!bVar2 * auVar44._44_4_;
        bVar2 = (bool)(bVar10 >> 4 & 1);
        auVar41._48_4_ = (uint)bVar2 * auVar42._48_4_ | (uint)!bVar2 * auVar44._48_4_;
        bVar2 = (bool)(bVar10 >> 5 & 1);
        auVar41._52_4_ = (uint)bVar2 * auVar42._52_4_ | (uint)!bVar2 * auVar44._52_4_;
        bVar2 = (bool)(bVar10 >> 6 & 1);
        auVar41._56_4_ = (uint)bVar2 * auVar42._56_4_ | (uint)!bVar2 * auVar44._56_4_;
        auVar41._60_4_ =
             (uint)(bVar10 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar44._60_4_;
        auVar37 = vextracti64x4_avx512f(auVar41,1);
        auVar41 = vpmaxsd_avx512f(auVar41,ZEXT3264(auVar37));
        auVar36 = vpmaxsd_avx(auVar41._0_16_,auVar41._16_16_);
        auVar45 = vpshufd_avx(auVar36,0xee);
        auVar36 = vpmaxsd_avx(auVar36,auVar45);
        auVar45 = vpshufd_avx(auVar36,0x55);
        auVar36 = vpmaxsd_avx(auVar36,auVar45);
        uVar26 = (ulong)auVar36._0_4_;
      }
      iVar21 = iVar20 + iVar21;
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar9);
    uVar30 = (uint)uVar26;
    bVar2 = 0 < (int)uVar30;
    if ((int)uVar30 < 1) {
      bVar2 = false;
      iVar21 = 0;
    }
    else {
      iVar21 = 0;
      pauVar28 = (undefined1 (*) [16])vertex;
      do {
        local_c38._0_32_ = vcvtps2pd_avx(*pauVar28);
        auVar37._8_8_ = 0x7fffffffffffffff;
        auVar37._0_8_ = 0x7fffffffffffffff;
        auVar37._16_8_ = 0x7fffffffffffffff;
        auVar37._24_8_ = 0x7fffffffffffffff;
        auVar37 = vpandq_avx512vl(local_c38._0_32_,auVar37);
        auVar8._8_8_ = 0x7fefffffffffffff;
        auVar8._0_8_ = 0x7fefffffffffffff;
        auVar8._16_8_ = 0x7fefffffffffffff;
        auVar8._24_8_ = 0x7fefffffffffffff;
        uVar15 = vpcmpgtq_avx512vl(auVar37,auVar8);
        if ((((uVar15 & 0xf) != 0) || (NAN(*(float *)(*pauVar28 + 4)))) ||
           (NAN(*(float *)(*pauVar28 + 8)) || NAN(*(float *)(*pauVar28 + 0xc)))) {
LAB_00867c54:
          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                        ,0x159,
                        "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)"
                       );
        }
        AddVertex(this,(dgBigVector *)local_c38);
        puVar22 = *pauVar28;
        pauVar28 = (undefined1 (*) [16])(*pauVar28 + (long)(vertexStrideInBytes >> 2) * 4);
        iVar21 = iVar21 + (uint)((float)iVar21 < *(float *)(puVar22 + 0xc));
        uVar26 = uVar26 - 1;
      } while (uVar26 != 0);
    }
    if (0 < faceCount) {
      auVar38 = ZEXT1664(_DAT_009e2030);
      uVar15 = 0;
      local_ce4 = 0;
      lVar24 = (long)(uv0StrideInBytes >> 2);
      lVar23 = (long)(normalStrideInBytes >> 2);
      local_c48 = lVar23;
      local_c40 = lVar24;
      do {
        iVar20 = faceIndexCount[uVar15];
        local_c58 = uVar15;
        if (0 < (long)iVar20) {
          lVar16 = (long)local_ce4;
          lVar32 = 0;
          iVar29 = local_c50[uVar15];
          do {
            local_c38._0_32_ =
                 *(undefined1 (*) [32])
                  &this->m_points[vertexIndex[lVar16 + lVar32]].super_dgTemplateVector<double>;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = *(ulong *)(normal + normalIndex[lVar16 + lVar32] * lVar23 + 1);
            auVar36 = vpermt2ps_avx512vl(auVar36,auVar38._0_16_,
                                         ZEXT416((uint)normal[normalIndex[lVar16 + lVar32] * lVar23]
                                                ));
            auVar36 = vinsertps_avx(auVar36,ZEXT416((uint)uv0[uv0Index[lVar16 + lVar32] * lVar24]),
                                    0x30);
            local_c38._32_32_ = vcvtps2pd_avx(auVar36);
            lVar23 = (long)uv1Index[lVar16 + lVar32] * (long)(uv1StrideInBytes >> 2);
            auVar36 = vinsertps_avx(ZEXT416((uint)uv0[uv0Index[lVar16 + lVar32] * lVar24 + 1]),
                                    ZEXT416((uint)uv1[lVar23]),0x10);
            local_bf8 = vcvtps2pd_avx(auVar36);
            local_be8 = (double)(float)uv1[lVar23 + 1];
            local_be0 = (double)iVar29;
            AddAtribute(this,(dgVertexAtribute *)local_c38);
            auVar38 = ZEXT1664(_DAT_009e2030);
            lVar32 = lVar32 + 1;
            lVar23 = local_c48;
            lVar24 = local_c40;
          } while (iVar20 != lVar32);
        }
        local_ce4 = iVar20 + local_ce4;
        uVar15 = local_c58 + 1;
      } while (uVar15 != uVar9);
    }
  }
  iVar20 = this->m_atribCount;
  local_c68.super_dgStackBase.m_ptr = malloc((long)(iVar20 * 4));
  local_c68.m_size = iVar20;
  if (iVar20 < 0) {
    pcVar17 = "T &dgStack<int>::operator[](hacd::HaI32) [T = int]";
  }
  else {
    HVar14 = dgVertexListToIndexList
                       ((HaF64 *)this->m_attib,0x60,0xc,iVar20,
                        (HaI32 *)local_c68.super_dgStackBase.m_ptr,0.0);
    this->m_atribCount = HVar14;
    local_c78.super_dgStackBase.m_ptr = malloc((long)faceCount);
    local_c78.m_size = faceCount;
    if (-1 < faceCount) {
      memset(local_c78.super_dgStackBase.m_ptr,1,(long)faceCount);
      if (faceCount != 0) {
        iVar29 = 0;
        iVar20 = 0;
        do {
          uVar15 = 0;
          iVar31 = 0;
          bVar13 = false;
          do {
            count = faceIndexCount[uVar15];
            lVar23 = (long)count;
            if (0xff < lVar23) {
              __assert_fail("indexCount < hacd::HaI32 (sizeof (index) / sizeof (index[0]))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMeshEffect.cpp"
                            ,0x4ed,
                            "void dgMeshEffect::BuildFromVertexListIndexList(hacd::HaI32, const hacd::HaI32 *const, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const)"
                           );
            }
            pcVar17 = dgStack<signed_char>::operator[](&local_c78,(HaI32)uVar15);
            bVar12 = bVar13;
            if (*pcVar17 != '\0') {
              if (0 < count) {
                lVar24 = 0;
                do {
                  *(HaI32 *)(local_434 + lVar24 * 4 + -4) = vertexIndex[iVar31 + lVar24] + iVar29;
                  piVar18 = dgStack<int>::operator[](&local_c68,iVar31 + (int)lVar24);
                  *(long *)(local_c38 + lVar24 * 8) = (long)*piVar18;
                  lVar24 = lVar24 + 1;
                } while (lVar23 != lVar24);
              }
              pdVar19 = dgPolyhedra::AddFace
                                  (&this->super_dgPolyhedra,count,(HaI32 *)&local_438,
                                   (HaI64 *)local_c38);
              if (pdVar19 == (dgEdge *)0x0) {
                bVar12 = true;
                if (1 < count) {
                  uVar26 = lVar23 + 0xe;
                  puVar22 = local_434;
                  uVar25 = 0;
                  bVar10 = 0;
                  do {
                    bVar11 = bVar10;
                    auVar38 = vpbroadcastd_avx512f(ZEXT416(*(uint *)(local_434 + uVar25 * 4 + -4)));
                    auVar39 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                    auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    uVar25 = uVar25 + 1;
                    auVar41 = vpbroadcastq_avx512f();
                    uVar27 = 0;
                    uVar5 = 0;
                    do {
                      uVar34 = uVar5;
                      auVar42 = vpbroadcastq_avx512f();
                      auVar43 = vporq_avx512f(auVar42,auVar39);
                      auVar42 = vporq_avx512f(auVar42,auVar40);
                      uVar3 = vpcmpuq_avx512f(auVar42,auVar41,2);
                      uVar4 = vpcmpuq_avx512f(auVar43,auVar41,2);
                      bVar10 = (byte)uVar4;
                      uVar35 = CONCAT11(bVar10,(byte)uVar3);
                      auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar22 + uVar27 * 4));
                      auVar44._4_4_ = (uint)((byte)(uVar35 >> 1) & 1) * auVar42._4_4_;
                      auVar44._0_4_ = (uint)((byte)uVar3 & 1) * auVar42._0_4_;
                      auVar44._8_4_ = (uint)((byte)(uVar35 >> 2) & 1) * auVar42._8_4_;
                      auVar44._12_4_ = (uint)((byte)(uVar35 >> 3) & 1) * auVar42._12_4_;
                      auVar44._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * auVar42._16_4_;
                      auVar44._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * auVar42._20_4_;
                      auVar44._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * auVar42._24_4_;
                      auVar44._28_4_ = (uint)((byte)(uVar35 >> 7) & 1) * auVar42._28_4_;
                      auVar44._32_4_ = (uint)(bVar10 & 1) * auVar42._32_4_;
                      auVar44._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar42._36_4_;
                      auVar44._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar42._40_4_;
                      auVar44._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar42._44_4_;
                      auVar44._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar42._48_4_;
                      auVar44._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar42._52_4_;
                      auVar44._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar42._56_4_;
                      auVar44._60_4_ = (uint)(bVar10 >> 7) * auVar42._60_4_;
                      uVar27 = uVar27 + 0x10;
                      uVar3 = vpcmpeqd_avx512f(auVar38,auVar44);
                      uVar5 = uVar34 | (ushort)uVar3;
                    } while ((uVar26 & 0xfffffffffffffff0) != uVar27);
                    bVar1 = (uVar5 & uVar35) != 0 || (~uVar35 & uVar34) != 0;
                    uVar26 = uVar26 - 1;
                    puVar22 = puVar22 + 4;
                    bVar10 = bVar11 | bVar1;
                  } while (uVar25 != count - 1);
                  if ((bool)(bVar11 | bVar1)) goto LAB_008679b6;
                }
              }
              else {
LAB_008679b6:
                pcVar17 = dgStack<signed_char>::operator[](&local_c78,(HaI32)uVar15);
                *pcVar17 = '\0';
                bVar12 = bVar13;
              }
            }
            iVar31 = count + iVar31;
            uVar15 = uVar15 + 1;
            bVar13 = bVar12;
          } while (uVar15 != uVar9);
          if (!bVar12) break;
          iVar20 = iVar20 + 1;
          if (bVar2) {
            uVar15 = (ulong)uVar30;
            pfVar33 = (float *)(vertex + 2);
            do {
              auVar45._8_8_ = 0;
              auVar45._0_8_ = *(ulong *)(pfVar33 + -2);
              local_c38._16_8_ = (undefined8)*pfVar33;
              local_c38._0_16_ = vcvtps2pd_avx(auVar45);
              local_c38._24_8_ = (double)(iVar21 + iVar20);
              if (((NAN(*pfVar33)) || (0x7fefffffffffffff < (long)ABS((double)local_c38._16_8_))) ||
                 (auVar36 = vmovshdup_avx(auVar45), NAN(auVar36._0_4_))) goto LAB_00867c54;
              auVar6._8_8_ = 0x7fffffffffffffff;
              auVar6._0_8_ = 0x7fffffffffffffff;
              auVar36 = vpandq_avx512vl(local_c38._0_16_,auVar6);
              auVar7._8_8_ = 0x7fefffffffffffff;
              auVar7._0_8_ = 0x7fefffffffffffff;
              uVar26 = vpcmpgtq_avx512vl(auVar36,auVar7);
              if (((uVar26 & 1) != 0) || ((char)((uVar26 & 3) >> 1) != '\0')) goto LAB_00867c54;
              AddVertex(this,(dgBigVector *)local_c38);
              pfVar33 = pfVar33 + (vertexStrideInBytes >> 2);
              uVar15 = uVar15 - 1;
            } while (uVar15 != 0);
            if (!bVar12) break;
          }
          iVar29 = iVar20 * uVar30;
        } while (faceCount != 0);
      }
      dgPolyhedra::EndFace(&this->super_dgPolyhedra);
      PackVertexArrays(this);
      free(local_c78.super_dgStackBase.m_ptr);
      free(local_c68.super_dgStackBase.m_ptr);
      return;
    }
    pcVar17 = "T &dgStack<signed char>::operator[](hacd::HaI32) [T = signed char]";
  }
  __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,0x60,pcVar17);
}

Assistant:

void dgMeshEffect::BuildFromVertexListIndexList(
	hacd::HaI32 faceCount, const hacd::HaI32* const faceIndexCount, const hacd::HaI32* const faceMaterialIndex, 
	const hacd::HaF32* const vertex, hacd::HaI32 vertexStrideInBytes, const hacd::HaI32* const vertexIndex,
	const hacd::HaF32* const normal, hacd::HaI32  normalStrideInBytes, const hacd::HaI32* const normalIndex,
	const hacd::HaF32* const uv0, hacd::HaI32  uv0StrideInBytes, const hacd::HaI32* const uv0Index,
	const hacd::HaF32* const uv1, hacd::HaI32  uv1StrideInBytes, const hacd::HaI32* const uv1Index)
{
	BeginPolygon ();

	// calculate vertex Count
	hacd::HaI32 acc = 0;
	hacd::HaI32 vertexCount = 0;
	for (hacd::HaI32 j = 0; j < faceCount; j ++) {
		int count = faceIndexCount[j];
		for (int i = 0; i < count; i ++) {
			vertexCount = GetMax(vertexCount, vertexIndex[acc + i] + 1);
		}
		acc += count;
	}
		
	hacd::HaI32 layerCountBase = 0;
	hacd::HaI32 vertexStride = hacd::HaI32 (vertexStrideInBytes / sizeof (hacd::HaF32));
	for (int i = 0; i < vertexCount; i ++) {
		int index = i * vertexStride;
		AddVertex (dgBigVector (vertex[index + 0], vertex[index + 1], vertex[index + 2], vertex[index + 3]));
		layerCountBase += (vertex[index + 3]) > hacd::HaF32(layerCountBase);
	}


	acc = 0;
	hacd::HaI32 normalStride = hacd::HaI32 (normalStrideInBytes / sizeof (hacd::HaF32));
	hacd::HaI32 uv0Stride = hacd::HaI32 (uv0StrideInBytes / sizeof (hacd::HaF32));
	hacd::HaI32 uv1Stride = hacd::HaI32 (uv1StrideInBytes / sizeof (hacd::HaF32));
	for (hacd::HaI32 j = 0; j < faceCount; j ++) {
		hacd::HaI32 indexCount = faceIndexCount[j];
		hacd::HaI32 materialIndex = faceMaterialIndex[j];
		for (hacd::HaI32 i = 0; i < indexCount; i ++) {
			dgVertexAtribute point;
			hacd::HaI32 index = vertexIndex[acc + i];
			point.m_vertex = m_points[index];
			
			index = normalIndex[(acc + i)] * normalStride;
			point.m_normal_x =  normal[index + 0];
			point.m_normal_y =  normal[index + 1];
			point.m_normal_z =  normal[index + 2];

			index = uv0Index[(acc + i)] * uv0Stride;
			point.m_u0 = uv0[index + 0];
			point.m_v0 = uv0[index + 1];
			
			index = uv1Index[(acc + i)] * uv1Stride;
			point.m_u1 = uv1[index + 0];
			point.m_v1 = uv1[index + 1];

			point.m_material = materialIndex;
			AddAtribute(point);
		}
		acc += indexCount;
	}


	dgStack<hacd::HaI32>attrIndexMap(m_atribCount);
	m_atribCount = dgVertexListToIndexList (&m_attib[0].m_vertex.m_x, sizeof (dgVertexAtribute), sizeof (dgVertexAtribute) / sizeof (hacd::HaF64), m_atribCount, &attrIndexMap[0], DG_VERTEXLIST_INDEXLIST_TOL);

	bool hasFaces = true;
	dgStack<hacd::HaI8> faceMark (faceCount);
	memset (&faceMark[0], 1, size_t (faceMark.GetSizeInBytes()));
	
	hacd::HaI32 layerCount = 0;
	while (hasFaces) {
		acc = 0;
		hasFaces = false;
		hacd::HaI32 vertexBank = layerCount * vertexCount;
		for (hacd::HaI32 j = 0; j < faceCount; j ++) {
			hacd::HaI32 index[256];
			hacd::HaI64 userdata[256];

			int indexCount = faceIndexCount[j];
			HACD_ASSERT (indexCount < hacd::HaI32 (sizeof (index) / sizeof (index[0])));

			if (faceMark[j]) {
				for (int i = 0; i < indexCount; i ++) {
					index[i] = vertexIndex[acc + i] + vertexBank;
					userdata[i] = attrIndexMap[acc + i];
				}
				dgEdge* const edge = AddFace (indexCount, index, userdata);
				if (edge) {
					faceMark[j] = 0;
				} else {
					// check if the face is not degenerated
					bool degeneratedFace = false;
					for (int i = 0; i < indexCount - 1; i ++) {
						for (int k = i + 1; k < indexCount; k ++) {
							if (index[i] == index[k]) {
								degeneratedFace = true;		
							}
						}
					}
					if (degeneratedFace) {
						faceMark[j] = 0;
					} else {
						hasFaces = true;
					}
				}
			}
			acc += indexCount;
		}
		if (hasFaces) {
			layerCount ++;
			for (int i = 0; i < vertexCount; i ++) {
				int index = i * vertexStride;
				AddVertex (dgBigVector (vertex[index + 0], vertex[index + 1], vertex[index + 2], hacd::HaF64 (layerCount + layerCountBase)));
			}
		}
	}

	EndFace();
	PackVertexArrays ();
//	RepairTJoints (true);
}